

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O3

bool __thiscall
anon_unknown.dwarf_1722e1b::NotInProjectDir::operator()(NotInProjectDir *this,string *p)

{
  char cVar1;
  bool bVar2;
  long in_RDX;
  cmCMakePath path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  path local_90;
  path local_68;
  path local_40;
  
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,p,(long)&(p->_M_dataplus)._M_p + in_RDX);
  cmCMakePath::cmCMakePath<std::__cxx11::string,cmCMakePath&>
            ((cmCMakePath *)&local_90,&local_b0,generic_format);
  cmCMakePath::Normal((cmCMakePath *)&local_68,(cmCMakePath *)&local_90);
  std::filesystem::__cxx11::path::~path(&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  cVar1 = std::filesystem::__cxx11::path::has_root_directory();
  if (cVar1 == '\0') {
    bVar2 = false;
  }
  else {
    cmCMakePath::cmCMakePath((cmCMakePath *)&local_90,this->SourceDir,generic_format);
    bVar2 = cmCMakePath::IsPrefix((cmCMakePath *)&local_90,(cmCMakePath *)&local_68);
    if (bVar2) {
      bVar2 = false;
    }
    else {
      cmCMakePath::cmCMakePath((cmCMakePath *)&local_40,this->BinaryDir,generic_format);
      bVar2 = cmCMakePath::IsPrefix((cmCMakePath *)&local_40,(cmCMakePath *)&local_68);
      bVar2 = !bVar2;
      std::filesystem::__cxx11::path::~path(&local_40);
    }
    std::filesystem::__cxx11::path::~path(&local_90);
  }
  std::filesystem::__cxx11::path::~path(&local_68);
  return bVar2;
}

Assistant:

bool operator()(const std::string& p) const
  {
    auto path = cmCMakePath(p).Normal();

    // Keep all relative paths:
    if (path.IsRelative()) {
      return false;
    }

    // If it's an absolute path, check if it starts with the source
    // directory:
    return !(cmCMakePath(this->SourceDir).IsPrefix(path) ||
             cmCMakePath(this->BinaryDir).IsPrefix(path));
  }